

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IFCCurve.cpp
# Opt level: O3

void __thiscall
Assimp::IFC::anon_unknown_9::Line::SampleDiscrete(Line *this,TempMesh *out,IfcFloat a,IfcFloat b)

{
  pointer *ppaVar1;
  iterator iVar2;
  int iVar3;
  _func_int **pp_Var4;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Da_00;
  undefined4 uVar5;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  IfcFloat IVar6;
  aiVector3t<double> local_30;
  IfcFloat local_18;
  
  local_18 = b;
  (*(this->super_Curve)._vptr_Curve[5])();
  iVar3 = (*(this->super_Curve)._vptr_Curve[2])(this);
  if (((char)iVar3 == '\0') &&
     ((a - (double)CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da) <= -1.1920928955078125e-07 ||
      (b - a <= -1.1920928955078125e-07)))) {
    __assert_fail("InRange( a )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xb4,
                  "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  IVar6 = a;
  (*(this->super_Curve)._vptr_Curve[5])(this);
  iVar3 = (*(this->super_Curve)._vptr_Curve[2])(this);
  if (((char)iVar3 == '\0') &&
     ((local_18 - (double)CONCAT44(extraout_XMM0_Db_00,extraout_XMM0_Da_00) <=
       -1.1920928955078125e-07 || (IVar6 - local_18 <= -1.1920928955078125e-07)))) {
    __assert_fail("InRange( b )",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/quantumsheep[P]unicy/libs/assimp/code/Importer/IFC/IFCCurve.cpp"
                  ,0xb5,
                  "virtual void Assimp::IFC::(anonymous namespace)::Line::SampleDiscrete(TempMesh &, IfcFloat, IfcFloat) const"
                 );
  }
  uVar5 = SUB84(a,0);
  if ((a != local_18) || (NAN(a) || NAN(local_18))) {
    std::vector<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>::reserve
              (&out->mVerts,
               ((long)(out->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_finish -
                (long)(out->mVerts).
                      super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                      _M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555 + 2);
    (*(this->super_Curve)._vptr_Curve[3])(uVar5,&local_30,this);
    iVar2._M_current =
         (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    if (iVar2._M_current ==
        (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
        _M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
      _M_realloc_insert<aiVector3t<double>>
                ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,iVar2,
                 &local_30);
    }
    else {
      (iVar2._M_current)->z = local_30.z;
      (iVar2._M_current)->x = local_30.x;
      (iVar2._M_current)->y = local_30.y;
      ppaVar1 = &(out->mVerts).
                 super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppaVar1 = *ppaVar1 + 1;
    }
    pp_Var4 = (this->super_Curve)._vptr_Curve;
    uVar5 = SUB84(local_18,0);
  }
  else {
    pp_Var4 = (this->super_Curve)._vptr_Curve;
  }
  (*pp_Var4[3])(uVar5,&local_30,this);
  iVar2._M_current =
       (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (out->mVerts).super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>.
      _M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<aiVector3t<double>,std::allocator<aiVector3t<double>>>::
    _M_realloc_insert<aiVector3t<double>>
              ((vector<aiVector3t<double>,std::allocator<aiVector3t<double>>> *)out,iVar2,&local_30)
    ;
  }
  else {
    (iVar2._M_current)->z = local_30.z;
    (iVar2._M_current)->x = local_30.x;
    (iVar2._M_current)->y = local_30.y;
    ppaVar1 = &(out->mVerts).
               super__Vector_base<aiVector3t<double>,_std::allocator<aiVector3t<double>_>_>._M_impl.
               super__Vector_impl_data._M_finish;
    *ppaVar1 = *ppaVar1 + 1;
  }
  return;
}

Assistant:

void SampleDiscrete(TempMesh& out,IfcFloat a, IfcFloat b) const {
        ai_assert( InRange( a ) );
        ai_assert( InRange( b ) );

        if (a == b) {
            out.mVerts.push_back(Eval(a));
            return;
        }
        out.mVerts.reserve(out.mVerts.size()+2);
        out.mVerts.push_back(Eval(a));
        out.mVerts.push_back(Eval(b));
    }